

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovQueue.cpp
# Opt level: O3

void __thiscall
cov::Queue::Queue(Queue *this,Context *context,Device *device,bool isOutOfOrder,bool enableProfiling
                 )

{
  ObjectMagic *pOVar1;
  IcdDispatch *pIVar2;
  
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_magic = QUEUE_MAGIC;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess = true;
  pIVar2 = getIcdTable();
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_icdTable = pIVar2;
  this->m_context = context;
  this->m_device = device;
  this->m_isOutOfOrder = isOutOfOrder;
  this->m_enableProfiling = enableProfiling;
  this->m_vkQueue = context->m_vkQueue;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess = true;
  LOCK();
  pOVar1 = &(context->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
  *(int *)pOVar1 = *(int *)pOVar1 + 1;
  UNLOCK();
  return;
}

Assistant:

Queue::Queue(Context& context, Device& device, bool isOutOfOrder, bool enableProfiling)
    : m_context(context),
      m_device(device),
      m_isOutOfOrder(isOutOfOrder),
      m_enableProfiling(enableProfiling),
      m_vkQueue(context.m_vkQueue)
{
    m_initSuccess = true; // fixme
    if (m_initSuccess) m_context.retain();
}